

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Wasm::WasmBytecodeGenerator::PrintOpBegin(WasmBytecodeGenerator *this,WasmOp op)

{
  byte bVar1;
  WasmBlock WVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  uint uVar6;
  WasmType type;
  char16 *pcVar7;
  WasmFunctionInfo *this_00;
  FunctionBody *this_01;
  WasmReaderBase *pWVar8;
  uint32 offset;
  uint8 alignment;
  WasmFunctionInfo *func;
  Type funcType;
  uint32 id;
  anon_class_8_1_8991fb9c PrintSignature;
  int depth;
  WasmOp op_local;
  WasmBytecodeGenerator *this_local;
  
  PrintSignature.this._6_2_ = op;
  if (this->lastOpId == this->opId) {
    Output::Print(L"\r\n");
  }
  uVar4 = this->opId + 1;
  this->opId = uVar4;
  this->lastOpId = uVar4;
  iVar5 = JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Count
                    (&this->m_blockInfos);
  PrintSignature.this._0_4_ = iVar5 + -1;
  if (0 < (int)PrintSignature.this) {
    Output::SkipToColumn((long)(int)PrintSignature.this);
  }
  _funcType = this;
  if (PrintSignature.this._6_2_ == wbUnreachable) {
    Output::Print(L"Unreachable");
  }
  else if (PrintSignature.this._6_2_ == wbNop) {
    Output::Print(L"Nop");
  }
  else if (PrintSignature.this._6_2_ == wbBlock) {
    Output::Print(L"Block");
  }
  else if (PrintSignature.this._6_2_ == wbLoop) {
    Output::Print(L"Loop");
  }
  else if (PrintSignature.this._6_2_ == wbIf) {
    Output::Print(L"If");
  }
  else if (PrintSignature.this._6_2_ == wbElse) {
    Output::Print(L"Else");
  }
  else if (PrintSignature.this._6_2_ == wbEnd) {
    Output::Print(L"End");
  }
  else if (PrintSignature.this._6_2_ == wbBr) {
    Output::Print(L"Br");
  }
  else if (PrintSignature.this._6_2_ == wbBrIf) {
    Output::Print(L"BrIf");
  }
  else if (PrintSignature.this._6_2_ == wbBrTable) {
    Output::Print(L"BrTable");
  }
  else if (PrintSignature.this._6_2_ == wbReturn) {
    Output::Print(L"Return");
  }
  else if (PrintSignature.this._6_2_ == wbCall) {
    Output::Print(L"Call");
  }
  else if (PrintSignature.this._6_2_ == wbCallIndirect) {
    Output::Print(L"CallIndirect");
  }
  else if (PrintSignature.this._6_2_ == wbDrop) {
    Output::Print(L"Drop");
  }
  else if (PrintSignature.this._6_2_ == wbSelect) {
    Output::Print(L"Select");
  }
  else if (PrintSignature.this._6_2_ == wbGetLocal) {
    Output::Print(L"GetLocal");
  }
  else if (PrintSignature.this._6_2_ == wbSetLocal) {
    Output::Print(L"SetLocal");
  }
  else if (PrintSignature.this._6_2_ == wbTeeLocal) {
    Output::Print(L"TeeLocal");
  }
  else if (PrintSignature.this._6_2_ == wbGetGlobal) {
    Output::Print(L"GetGlobal");
  }
  else if (PrintSignature.this._6_2_ == wbSetGlobal) {
    Output::Print(L"SetGlobal");
  }
  else if (PrintSignature.this._6_2_ == wbI32LoadMem) {
    Output::Print(L"I32LoadMem");
  }
  else if (PrintSignature.this._6_2_ == wbI64LoadMem) {
    Output::Print(L"I64LoadMem");
  }
  else if (PrintSignature.this._6_2_ == wbF32LoadMem) {
    Output::Print(L"F32LoadMem");
  }
  else if (PrintSignature.this._6_2_ == wbF64LoadMem) {
    Output::Print(L"F64LoadMem");
  }
  else if (PrintSignature.this._6_2_ == wbI32LoadMem8S) {
    Output::Print(L"I32LoadMem8S");
  }
  else if (PrintSignature.this._6_2_ == wbI32LoadMem8U) {
    Output::Print(L"I32LoadMem8U");
  }
  else if (PrintSignature.this._6_2_ == wbI32LoadMem16S) {
    Output::Print(L"I32LoadMem16S");
  }
  else if (PrintSignature.this._6_2_ == wbI32LoadMem16U) {
    Output::Print(L"I32LoadMem16U");
  }
  else if (PrintSignature.this._6_2_ == wbI64LoadMem8S) {
    Output::Print(L"I64LoadMem8S");
  }
  else if (PrintSignature.this._6_2_ == wbI64LoadMem8U) {
    Output::Print(L"I64LoadMem8U");
  }
  else if (PrintSignature.this._6_2_ == wbI64LoadMem16S) {
    Output::Print(L"I64LoadMem16S");
  }
  else if (PrintSignature.this._6_2_ == wbI64LoadMem16U) {
    Output::Print(L"I64LoadMem16U");
  }
  else if (PrintSignature.this._6_2_ == wbI64LoadMem32S) {
    Output::Print(L"I64LoadMem32S");
  }
  else if (PrintSignature.this._6_2_ == wbI64LoadMem32U) {
    Output::Print(L"I64LoadMem32U");
  }
  else if (PrintSignature.this._6_2_ == wbI32StoreMem) {
    Output::Print(L"I32StoreMem");
  }
  else if (PrintSignature.this._6_2_ == wbI64StoreMem) {
    Output::Print(L"I64StoreMem");
  }
  else if (PrintSignature.this._6_2_ == wbF32StoreMem) {
    Output::Print(L"F32StoreMem");
  }
  else if (PrintSignature.this._6_2_ == wbF64StoreMem) {
    Output::Print(L"F64StoreMem");
  }
  else if (PrintSignature.this._6_2_ == wbI32StoreMem8) {
    Output::Print(L"I32StoreMem8");
  }
  else if (PrintSignature.this._6_2_ == wbI32StoreMem16) {
    Output::Print(L"I32StoreMem16");
  }
  else if (PrintSignature.this._6_2_ == wbI64StoreMem8) {
    Output::Print(L"I64StoreMem8");
  }
  else if (PrintSignature.this._6_2_ == wbI64StoreMem16) {
    Output::Print(L"I64StoreMem16");
  }
  else if (PrintSignature.this._6_2_ == wbI64StoreMem32) {
    Output::Print(L"I64StoreMem32");
  }
  else if (PrintSignature.this._6_2_ == wbMemorySize) {
    Output::Print(L"MemorySize");
  }
  else if (PrintSignature.this._6_2_ == wbMemoryGrow) {
    Output::Print(L"MemoryGrow");
  }
  else if (PrintSignature.this._6_2_ == wbI32Const) {
    Output::Print(L"I32Const");
  }
  else if (PrintSignature.this._6_2_ == wbI64Const) {
    Output::Print(L"I64Const");
  }
  else if (PrintSignature.this._6_2_ == wbF32Const) {
    Output::Print(L"F32Const");
  }
  else if (PrintSignature.this._6_2_ == wbF64Const) {
    Output::Print(L"F64Const");
  }
  else if (PrintSignature.this._6_2_ == wbI32Eqz) {
    Output::Print(L"I32Eqz");
  }
  else if (PrintSignature.this._6_2_ == wbI32Eq) {
    Output::Print(L"I32Eq");
  }
  else if (PrintSignature.this._6_2_ == wbI32Ne) {
    Output::Print(L"I32Ne");
  }
  else if (PrintSignature.this._6_2_ == wbI32LtS) {
    Output::Print(L"I32LtS");
  }
  else if (PrintSignature.this._6_2_ == wbI32LtU) {
    Output::Print(L"I32LtU");
  }
  else if (PrintSignature.this._6_2_ == wbI32GtS) {
    Output::Print(L"I32GtS");
  }
  else if (PrintSignature.this._6_2_ == wbI32GtU) {
    Output::Print(L"I32GtU");
  }
  else if (PrintSignature.this._6_2_ == wbI32LeS) {
    Output::Print(L"I32LeS");
  }
  else if (PrintSignature.this._6_2_ == wbI32LeU) {
    Output::Print(L"I32LeU");
  }
  else if (PrintSignature.this._6_2_ == wbI32GeS) {
    Output::Print(L"I32GeS");
  }
  else if (PrintSignature.this._6_2_ == wbI32GeU) {
    Output::Print(L"I32GeU");
  }
  else if (PrintSignature.this._6_2_ == wbI64Eqz) {
    Output::Print(L"I64Eqz");
  }
  else if (PrintSignature.this._6_2_ == wbI64Eq) {
    Output::Print(L"I64Eq");
  }
  else if (PrintSignature.this._6_2_ == wbI64Ne) {
    Output::Print(L"I64Ne");
  }
  else if (PrintSignature.this._6_2_ == wbI64LtS) {
    Output::Print(L"I64LtS");
  }
  else if (PrintSignature.this._6_2_ == wbI64LtU) {
    Output::Print(L"I64LtU");
  }
  else if (PrintSignature.this._6_2_ == wbI64GtS) {
    Output::Print(L"I64GtS");
  }
  else if (PrintSignature.this._6_2_ == wbI64GtU) {
    Output::Print(L"I64GtU");
  }
  else if (PrintSignature.this._6_2_ == wbI64LeS) {
    Output::Print(L"I64LeS");
  }
  else if (PrintSignature.this._6_2_ == wbI64LeU) {
    Output::Print(L"I64LeU");
  }
  else if (PrintSignature.this._6_2_ == wbI64GeS) {
    Output::Print(L"I64GeS");
  }
  else if (PrintSignature.this._6_2_ == wbI64GeU) {
    Output::Print(L"I64GeU");
  }
  else if (PrintSignature.this._6_2_ == wbF32Eq) {
    Output::Print(L"F32Eq");
  }
  else if (PrintSignature.this._6_2_ == wbF32Ne) {
    Output::Print(L"F32Ne");
  }
  else if (PrintSignature.this._6_2_ == wbF32Lt) {
    Output::Print(L"F32Lt");
  }
  else if (PrintSignature.this._6_2_ == wbF32Gt) {
    Output::Print(L"F32Gt");
  }
  else if (PrintSignature.this._6_2_ == wbF32Le) {
    Output::Print(L"F32Le");
  }
  else if (PrintSignature.this._6_2_ == wbF32Ge) {
    Output::Print(L"F32Ge");
  }
  else if (PrintSignature.this._6_2_ == wbF64Eq) {
    Output::Print(L"F64Eq");
  }
  else if (PrintSignature.this._6_2_ == wbF64Ne) {
    Output::Print(L"F64Ne");
  }
  else if (PrintSignature.this._6_2_ == wbF64Lt) {
    Output::Print(L"F64Lt");
  }
  else if (PrintSignature.this._6_2_ == wbF64Gt) {
    Output::Print(L"F64Gt");
  }
  else if (PrintSignature.this._6_2_ == wbF64Le) {
    Output::Print(L"F64Le");
  }
  else if (PrintSignature.this._6_2_ == wbF64Ge) {
    Output::Print(L"F64Ge");
  }
  else if (PrintSignature.this._6_2_ == wbI32Clz) {
    Output::Print(L"I32Clz");
  }
  else if (PrintSignature.this._6_2_ == wbI32Ctz) {
    Output::Print(L"I32Ctz");
  }
  else if (PrintSignature.this._6_2_ == wbI32Popcnt) {
    Output::Print(L"I32Popcnt");
  }
  else if (PrintSignature.this._6_2_ == wbI32Add) {
    Output::Print(L"I32Add");
  }
  else if (PrintSignature.this._6_2_ == wbI32Sub) {
    Output::Print(L"I32Sub");
  }
  else if (PrintSignature.this._6_2_ == wbI32Mul) {
    Output::Print(L"I32Mul");
  }
  else if (PrintSignature.this._6_2_ == wbI32DivS) {
    Output::Print(L"I32DivS");
  }
  else if (PrintSignature.this._6_2_ == wbI32DivU) {
    Output::Print(L"I32DivU");
  }
  else if (PrintSignature.this._6_2_ == wbI32RemS) {
    Output::Print(L"I32RemS");
  }
  else if (PrintSignature.this._6_2_ == wbI32RemU) {
    Output::Print(L"I32RemU");
  }
  else if (PrintSignature.this._6_2_ == wbI32And) {
    Output::Print(L"I32And");
  }
  else if (PrintSignature.this._6_2_ == wbI32Or) {
    Output::Print(L"I32Or");
  }
  else if (PrintSignature.this._6_2_ == wbI32Xor) {
    Output::Print(L"I32Xor");
  }
  else if (PrintSignature.this._6_2_ == wbI32Shl) {
    Output::Print(L"I32Shl");
  }
  else if (PrintSignature.this._6_2_ == wbI32ShrS) {
    Output::Print(L"I32ShrS");
  }
  else if (PrintSignature.this._6_2_ == wbI32ShrU) {
    Output::Print(L"I32ShrU");
  }
  else if (PrintSignature.this._6_2_ == wbI32Rol) {
    Output::Print(L"I32Rol");
  }
  else if (PrintSignature.this._6_2_ == wbI32Ror) {
    Output::Print(L"I32Ror");
  }
  else if (PrintSignature.this._6_2_ == wbI64Clz) {
    Output::Print(L"I64Clz");
  }
  else if (PrintSignature.this._6_2_ == wbI64Ctz) {
    Output::Print(L"I64Ctz");
  }
  else if (PrintSignature.this._6_2_ == wbI64Popcnt) {
    Output::Print(L"I64Popcnt");
  }
  else if (PrintSignature.this._6_2_ == wbI64Add) {
    Output::Print(L"I64Add");
  }
  else if (PrintSignature.this._6_2_ == wbI64Sub) {
    Output::Print(L"I64Sub");
  }
  else if (PrintSignature.this._6_2_ == wbI64Mul) {
    Output::Print(L"I64Mul");
  }
  else if (PrintSignature.this._6_2_ == wbI64DivS) {
    Output::Print(L"I64DivS");
  }
  else if (PrintSignature.this._6_2_ == wbI64DivU) {
    Output::Print(L"I64DivU");
  }
  else if (PrintSignature.this._6_2_ == wbI64RemS) {
    Output::Print(L"I64RemS");
  }
  else if (PrintSignature.this._6_2_ == wbI64RemU) {
    Output::Print(L"I64RemU");
  }
  else if (PrintSignature.this._6_2_ == wbI64And) {
    Output::Print(L"I64And");
  }
  else if (PrintSignature.this._6_2_ == wbI64Or) {
    Output::Print(L"I64Or");
  }
  else if (PrintSignature.this._6_2_ == wbI64Xor) {
    Output::Print(L"I64Xor");
  }
  else if (PrintSignature.this._6_2_ == wbI64Shl) {
    Output::Print(L"I64Shl");
  }
  else if (PrintSignature.this._6_2_ == wbI64ShrS) {
    Output::Print(L"I64ShrS");
  }
  else if (PrintSignature.this._6_2_ == wbI64ShrU) {
    Output::Print(L"I64ShrU");
  }
  else if (PrintSignature.this._6_2_ == wbI64Rol) {
    Output::Print(L"I64Rol");
  }
  else if (PrintSignature.this._6_2_ == wbI64Ror) {
    Output::Print(L"I64Ror");
  }
  else if (PrintSignature.this._6_2_ == wbF32Abs) {
    Output::Print(L"F32Abs");
  }
  else if (PrintSignature.this._6_2_ == wbF32Neg) {
    Output::Print(L"F32Neg");
  }
  else if (PrintSignature.this._6_2_ == wbF32Ceil) {
    Output::Print(L"F32Ceil");
  }
  else if (PrintSignature.this._6_2_ == wbF32Floor) {
    Output::Print(L"F32Floor");
  }
  else if (PrintSignature.this._6_2_ == wbF32Trunc) {
    Output::Print(L"F32Trunc");
  }
  else if (PrintSignature.this._6_2_ == wbF32NearestInt) {
    Output::Print(L"F32NearestInt");
  }
  else if (PrintSignature.this._6_2_ == wbF32Sqrt) {
    Output::Print(L"F32Sqrt");
  }
  else if (PrintSignature.this._6_2_ == wbF32Add) {
    Output::Print(L"F32Add");
  }
  else if (PrintSignature.this._6_2_ == wbF32Sub) {
    Output::Print(L"F32Sub");
  }
  else if (PrintSignature.this._6_2_ == wbF32Mul) {
    Output::Print(L"F32Mul");
  }
  else if (PrintSignature.this._6_2_ == wbF32Div) {
    Output::Print(L"F32Div");
  }
  else if (PrintSignature.this._6_2_ == wbF32Min) {
    Output::Print(L"F32Min");
  }
  else if (PrintSignature.this._6_2_ == wbF32Max) {
    Output::Print(L"F32Max");
  }
  else if (PrintSignature.this._6_2_ == wbF32CopySign) {
    Output::Print(L"F32CopySign");
  }
  else if (PrintSignature.this._6_2_ == wbF64Abs) {
    Output::Print(L"F64Abs");
  }
  else if (PrintSignature.this._6_2_ == wbF64Neg) {
    Output::Print(L"F64Neg");
  }
  else if (PrintSignature.this._6_2_ == wbF64Ceil) {
    Output::Print(L"F64Ceil");
  }
  else if (PrintSignature.this._6_2_ == wbF64Floor) {
    Output::Print(L"F64Floor");
  }
  else if (PrintSignature.this._6_2_ == wbF64Trunc) {
    Output::Print(L"F64Trunc");
  }
  else if (PrintSignature.this._6_2_ == wbF64NearestInt) {
    Output::Print(L"F64NearestInt");
  }
  else if (PrintSignature.this._6_2_ == wbF64Sqrt) {
    Output::Print(L"F64Sqrt");
  }
  else if (PrintSignature.this._6_2_ == wbF64Add) {
    Output::Print(L"F64Add");
  }
  else if (PrintSignature.this._6_2_ == wbF64Sub) {
    Output::Print(L"F64Sub");
  }
  else if (PrintSignature.this._6_2_ == wbF64Mul) {
    Output::Print(L"F64Mul");
  }
  else if (PrintSignature.this._6_2_ == wbF64Div) {
    Output::Print(L"F64Div");
  }
  else if (PrintSignature.this._6_2_ == wbF64Min) {
    Output::Print(L"F64Min");
  }
  else if (PrintSignature.this._6_2_ == wbF64Max) {
    Output::Print(L"F64Max");
  }
  else if (PrintSignature.this._6_2_ == wbF64CopySign) {
    Output::Print(L"F64CopySign");
  }
  else if (PrintSignature.this._6_2_ == wbI32Wrap_I64) {
    Output::Print(L"I32Wrap_I64");
  }
  else if (PrintSignature.this._6_2_ == wbI32TruncS_F32) {
    Output::Print(L"I32TruncS_F32");
  }
  else if (PrintSignature.this._6_2_ == wbI32TruncU_F32) {
    Output::Print(L"I32TruncU_F32");
  }
  else if (PrintSignature.this._6_2_ == wbI32TruncS_F64) {
    Output::Print(L"I32TruncS_F64");
  }
  else if (PrintSignature.this._6_2_ == wbI32TruncU_F64) {
    Output::Print(L"I32TruncU_F64");
  }
  else if (PrintSignature.this._6_2_ == wbI64ExtendS_I32) {
    Output::Print(L"I64ExtendS_I32");
  }
  else if (PrintSignature.this._6_2_ == wbI64ExtendU_I32) {
    Output::Print(L"I64ExtendU_I32");
  }
  else if (PrintSignature.this._6_2_ == wbI64TruncS_F32) {
    Output::Print(L"I64TruncS_F32");
  }
  else if (PrintSignature.this._6_2_ == wbI64TruncU_F32) {
    Output::Print(L"I64TruncU_F32");
  }
  else if (PrintSignature.this._6_2_ == wbI64TruncS_F64) {
    Output::Print(L"I64TruncS_F64");
  }
  else if (PrintSignature.this._6_2_ == wbI64TruncU_F64) {
    Output::Print(L"I64TruncU_F64");
  }
  else if (PrintSignature.this._6_2_ == wbF32SConvertI32) {
    Output::Print(L"F32SConvertI32");
  }
  else if (PrintSignature.this._6_2_ == wbF32UConvertI32) {
    Output::Print(L"F32UConvertI32");
  }
  else if (PrintSignature.this._6_2_ == wbF32SConvertI64) {
    Output::Print(L"F32SConvertI64");
  }
  else if (PrintSignature.this._6_2_ == wbF32UConvertI64) {
    Output::Print(L"F32UConvertI64");
  }
  else if (PrintSignature.this._6_2_ == wbF32DemoteF64) {
    Output::Print(L"F32DemoteF64");
  }
  else if (PrintSignature.this._6_2_ == wbF64SConvertI32) {
    Output::Print(L"F64SConvertI32");
  }
  else if (PrintSignature.this._6_2_ == wbF64UConvertI32) {
    Output::Print(L"F64UConvertI32");
  }
  else if (PrintSignature.this._6_2_ == wbF64SConvertI64) {
    Output::Print(L"F64SConvertI64");
  }
  else if (PrintSignature.this._6_2_ == wbF64UConvertI64) {
    Output::Print(L"F64UConvertI64");
  }
  else if (PrintSignature.this._6_2_ == wbF64PromoteF32) {
    Output::Print(L"F64PromoteF32");
  }
  else if (PrintSignature.this._6_2_ == wbI32ReinterpretF32) {
    Output::Print(L"I32ReinterpretF32");
  }
  else if (PrintSignature.this._6_2_ == wbI64ReinterpretF64) {
    Output::Print(L"I64ReinterpretF64");
  }
  else if (PrintSignature.this._6_2_ == wbF32ReinterpretI32) {
    Output::Print(L"F32ReinterpretI32");
  }
  else if (PrintSignature.this._6_2_ == wbF64ReinterpretI64) {
    Output::Print(L"F64ReinterpretI64");
  }
  else if (PrintSignature.this._6_2_ == wbI32Extend8_s) {
    Output::Print(L"I32Extend8_s");
  }
  else if (PrintSignature.this._6_2_ == wbI32Extend16_s) {
    Output::Print(L"I32Extend16_s");
  }
  else if (PrintSignature.this._6_2_ == wbI64Extend8_s) {
    Output::Print(L"I64Extend8_s");
  }
  else if (PrintSignature.this._6_2_ == wbI64Extend16_s) {
    Output::Print(L"I64Extend16_s");
  }
  else if (PrintSignature.this._6_2_ == wbI64Extend32_s) {
    Output::Print(L"I64Extend32_s");
  }
  else if (PrintSignature.this._6_2_ == wbPrintFuncName) {
    Output::Print(L"PrintFuncName");
  }
  else if (PrintSignature.this._6_2_ == wbPrintArgSeparator) {
    Output::Print(L"PrintArgSeparator");
  }
  else if (PrintSignature.this._6_2_ == wbPrintBeginCall) {
    Output::Print(L"PrintBeginCall");
  }
  else if (PrintSignature.this._6_2_ == wbPrintNewLine) {
    Output::Print(L"PrintNewLine");
  }
  else if (PrintSignature.this._6_2_ == wbPrintEndCall) {
    Output::Print(L"PrintEndCall");
  }
  else if (PrintSignature.this._6_2_ == wbPrintI32) {
    Output::Print(L"PrintI32");
  }
  else if (PrintSignature.this._6_2_ == wbPrintI64) {
    Output::Print(L"PrintI64");
  }
  else if (PrintSignature.this._6_2_ == wbPrintF32) {
    Output::Print(L"PrintF32");
  }
  else if (PrintSignature.this._6_2_ == wbPrintF64) {
    Output::Print(L"PrintF64");
  }
  else if (PrintSignature.this._6_2_ == wbI32SatTruncS_F32) {
    Output::Print(L"I32SatTruncS_F32");
  }
  else if (PrintSignature.this._6_2_ == wbI32SatTruncU_F32) {
    Output::Print(L"I32SatTruncU_F32");
  }
  else if (PrintSignature.this._6_2_ == wbI32SatTruncS_F64) {
    Output::Print(L"I32SatTruncS_F64");
  }
  else if (PrintSignature.this._6_2_ == wbI32SatTruncU_F64) {
    Output::Print(L"I32SatTruncU_F64");
  }
  else if (PrintSignature.this._6_2_ == wbI64SatTruncS_F32) {
    Output::Print(L"I64SatTruncS_F32");
  }
  else if (PrintSignature.this._6_2_ == wbI64SatTruncU_F32) {
    Output::Print(L"I64SatTruncU_F32");
  }
  else if (PrintSignature.this._6_2_ == wbI64SatTruncS_F64) {
    Output::Print(L"I64SatTruncS_F64");
  }
  else if (PrintSignature.this._6_2_ == wbI64SatTruncU_F64) {
    Output::Print(L"I64SatTruncU_F64");
  }
  else if (PrintSignature.this._6_2_ == wbV128Load) {
    Output::Print(L"V128Load");
  }
  else if (PrintSignature.this._6_2_ == wbV128Store) {
    Output::Print(L"V128Store");
  }
  else if (PrintSignature.this._6_2_ == wbV128Const) {
    Output::Print(L"V128Const");
  }
  else if (PrintSignature.this._6_2_ == wbV8X16Shuffle) {
    Output::Print(L"V8X16Shuffle");
  }
  else if (PrintSignature.this._6_2_ == wbI16Splat) {
    Output::Print(L"I16Splat");
  }
  else if (PrintSignature.this._6_2_ == wbI8Splat) {
    Output::Print(L"I8Splat");
  }
  else if (PrintSignature.this._6_2_ == wbI4Splat) {
    Output::Print(L"I4Splat");
  }
  else if (PrintSignature.this._6_2_ == wbI2Splat) {
    Output::Print(L"I2Splat");
  }
  else if (PrintSignature.this._6_2_ == wbF4Splat) {
    Output::Print(L"F4Splat");
  }
  else if (PrintSignature.this._6_2_ == wbF2Splat) {
    Output::Print(L"F2Splat");
  }
  else if (PrintSignature.this._6_2_ == wbI16ExtractLaneS) {
    Output::Print(L"I16ExtractLaneS");
  }
  else if (PrintSignature.this._6_2_ == wbI16ExtractLaneU) {
    Output::Print(L"I16ExtractLaneU");
  }
  else if (PrintSignature.this._6_2_ == wbI16ReplaceLane) {
    Output::Print(L"I16ReplaceLane");
  }
  else if (PrintSignature.this._6_2_ == wbI8ExtractLaneS) {
    Output::Print(L"I8ExtractLaneS");
  }
  else if (PrintSignature.this._6_2_ == wbI8ExtractLaneU) {
    Output::Print(L"I8ExtractLaneU");
  }
  else if (PrintSignature.this._6_2_ == wbI8ReplaceLane) {
    Output::Print(L"I8ReplaceLane");
  }
  else if (PrintSignature.this._6_2_ == wbI4ExtractLane) {
    Output::Print(L"I4ExtractLane");
  }
  else if (PrintSignature.this._6_2_ == wbI4ReplaceLane) {
    Output::Print(L"I4ReplaceLane");
  }
  else if (PrintSignature.this._6_2_ == wbI2ExtractLane) {
    Output::Print(L"I2ExtractLane");
  }
  else if (PrintSignature.this._6_2_ == wbI2ReplaceLane) {
    Output::Print(L"I2ReplaceLane");
  }
  else if (PrintSignature.this._6_2_ == wbF4ExtractLane) {
    Output::Print(L"F4ExtractLane");
  }
  else if (PrintSignature.this._6_2_ == wbF4ReplaceLane) {
    Output::Print(L"F4ReplaceLane");
  }
  else if (PrintSignature.this._6_2_ == wbF2ExtractLane) {
    Output::Print(L"F2ExtractLane");
  }
  else if (PrintSignature.this._6_2_ == wbF2ReplaceLane) {
    Output::Print(L"F2ReplaceLane");
  }
  else if (PrintSignature.this._6_2_ == wbI16Eq) {
    Output::Print(L"I16Eq");
  }
  else if (PrintSignature.this._6_2_ == wbI16Ne) {
    Output::Print(L"I16Ne");
  }
  else if (PrintSignature.this._6_2_ == wbI16LtS) {
    Output::Print(L"I16LtS");
  }
  else if (PrintSignature.this._6_2_ == wbI16LtU) {
    Output::Print(L"I16LtU");
  }
  else if (PrintSignature.this._6_2_ == wbI16GtS) {
    Output::Print(L"I16GtS");
  }
  else if (PrintSignature.this._6_2_ == wbI16GtU) {
    Output::Print(L"I16GtU");
  }
  else if (PrintSignature.this._6_2_ == wbI16LeS) {
    Output::Print(L"I16LeS");
  }
  else if (PrintSignature.this._6_2_ == wbI16LeU) {
    Output::Print(L"I16LeU");
  }
  else if (PrintSignature.this._6_2_ == wbI16GeS) {
    Output::Print(L"I16GeS");
  }
  else if (PrintSignature.this._6_2_ == wbI16GeU) {
    Output::Print(L"I16GeU");
  }
  else if (PrintSignature.this._6_2_ == wbI8Eq) {
    Output::Print(L"I8Eq");
  }
  else if (PrintSignature.this._6_2_ == wbI8Ne) {
    Output::Print(L"I8Ne");
  }
  else if (PrintSignature.this._6_2_ == wbI8LtS) {
    Output::Print(L"I8LtS");
  }
  else if (PrintSignature.this._6_2_ == wbI8LtU) {
    Output::Print(L"I8LtU");
  }
  else if (PrintSignature.this._6_2_ == wbI8GtS) {
    Output::Print(L"I8GtS");
  }
  else if (PrintSignature.this._6_2_ == wbI8GtU) {
    Output::Print(L"I8GtU");
  }
  else if (PrintSignature.this._6_2_ == wbI8LeS) {
    Output::Print(L"I8LeS");
  }
  else if (PrintSignature.this._6_2_ == wbI8LeU) {
    Output::Print(L"I8LeU");
  }
  else if (PrintSignature.this._6_2_ == wbI8GeS) {
    Output::Print(L"I8GeS");
  }
  else if (PrintSignature.this._6_2_ == wbI8GeU) {
    Output::Print(L"I8GeU");
  }
  else if (PrintSignature.this._6_2_ == wbI4Eq) {
    Output::Print(L"I4Eq");
  }
  else if (PrintSignature.this._6_2_ == wbI4Ne) {
    Output::Print(L"I4Ne");
  }
  else if (PrintSignature.this._6_2_ == wbI4LtS) {
    Output::Print(L"I4LtS");
  }
  else if (PrintSignature.this._6_2_ == wbI4LtU) {
    Output::Print(L"I4LtU");
  }
  else if (PrintSignature.this._6_2_ == wbI4GtS) {
    Output::Print(L"I4GtS");
  }
  else if (PrintSignature.this._6_2_ == wbI4GtU) {
    Output::Print(L"I4GtU");
  }
  else if (PrintSignature.this._6_2_ == wbI4LeS) {
    Output::Print(L"I4LeS");
  }
  else if (PrintSignature.this._6_2_ == wbI4LeU) {
    Output::Print(L"I4LeU");
  }
  else if (PrintSignature.this._6_2_ == wbI4GeS) {
    Output::Print(L"I4GeS");
  }
  else if (PrintSignature.this._6_2_ == wbI4GeU) {
    Output::Print(L"I4GeU");
  }
  else if (PrintSignature.this._6_2_ == wbF4Eq) {
    Output::Print(L"F4Eq");
  }
  else if (PrintSignature.this._6_2_ == wbF4Ne) {
    Output::Print(L"F4Ne");
  }
  else if (PrintSignature.this._6_2_ == wbF4Lt) {
    Output::Print(L"F4Lt");
  }
  else if (PrintSignature.this._6_2_ == wbF4Gt) {
    Output::Print(L"F4Gt");
  }
  else if (PrintSignature.this._6_2_ == wbF4Le) {
    Output::Print(L"F4Le");
  }
  else if (PrintSignature.this._6_2_ == wbF4Ge) {
    Output::Print(L"F4Ge");
  }
  else if (PrintSignature.this._6_2_ == wbF2Eq) {
    Output::Print(L"F2Eq");
  }
  else if (PrintSignature.this._6_2_ == wbF2Ne) {
    Output::Print(L"F2Ne");
  }
  else if (PrintSignature.this._6_2_ == wbF2Lt) {
    Output::Print(L"F2Lt");
  }
  else if (PrintSignature.this._6_2_ == wbF2Gt) {
    Output::Print(L"F2Gt");
  }
  else if (PrintSignature.this._6_2_ == wbF2Le) {
    Output::Print(L"F2Le");
  }
  else if (PrintSignature.this._6_2_ == wbF2Ge) {
    Output::Print(L"F2Ge");
  }
  else if (PrintSignature.this._6_2_ == wbV128Not) {
    Output::Print(L"V128Not");
  }
  else if (PrintSignature.this._6_2_ == wbV128And) {
    Output::Print(L"V128And");
  }
  else if (PrintSignature.this._6_2_ == wbV128Or) {
    Output::Print(L"V128Or");
  }
  else if (PrintSignature.this._6_2_ == wbV128Xor) {
    Output::Print(L"V128Xor");
  }
  else if (PrintSignature.this._6_2_ == wbV128Bitselect) {
    Output::Print(L"V128Bitselect");
  }
  else if (PrintSignature.this._6_2_ == wbI16Neg) {
    Output::Print(L"I16Neg");
  }
  else if (PrintSignature.this._6_2_ == wbI16AnyTrue) {
    Output::Print(L"I16AnyTrue");
  }
  else if (PrintSignature.this._6_2_ == wbI16AllTrue) {
    Output::Print(L"I16AllTrue");
  }
  else if (PrintSignature.this._6_2_ == wbI16Shl) {
    Output::Print(L"I16Shl");
  }
  else if (PrintSignature.this._6_2_ == wbI16ShrS) {
    Output::Print(L"I16ShrS");
  }
  else if (PrintSignature.this._6_2_ == wbI16ShrU) {
    Output::Print(L"I16ShrU");
  }
  else if (PrintSignature.this._6_2_ == wbI16Add) {
    Output::Print(L"I16Add");
  }
  else if (PrintSignature.this._6_2_ == wbI16AddSaturateS) {
    Output::Print(L"I16AddSaturateS");
  }
  else if (PrintSignature.this._6_2_ == wbI16AddSaturateU) {
    Output::Print(L"I16AddSaturateU");
  }
  else if (PrintSignature.this._6_2_ == wbI16Sub) {
    Output::Print(L"I16Sub");
  }
  else if (PrintSignature.this._6_2_ == wbI16SubSaturateS) {
    Output::Print(L"I16SubSaturateS");
  }
  else if (PrintSignature.this._6_2_ == wbI16SubSaturateU) {
    Output::Print(L"I16SubSaturateU");
  }
  else if (PrintSignature.this._6_2_ == wbI8Neg) {
    Output::Print(L"I8Neg");
  }
  else if (PrintSignature.this._6_2_ == wbI8AnyTrue) {
    Output::Print(L"I8AnyTrue");
  }
  else if (PrintSignature.this._6_2_ == wbI8AllTrue) {
    Output::Print(L"I8AllTrue");
  }
  else if (PrintSignature.this._6_2_ == wbI8Shl) {
    Output::Print(L"I8Shl");
  }
  else if (PrintSignature.this._6_2_ == wbI8ShrS) {
    Output::Print(L"I8ShrS");
  }
  else if (PrintSignature.this._6_2_ == wbI8ShrU) {
    Output::Print(L"I8ShrU");
  }
  else if (PrintSignature.this._6_2_ == wbI8Add) {
    Output::Print(L"I8Add");
  }
  else if (PrintSignature.this._6_2_ == wbI8AddSaturateS) {
    Output::Print(L"I8AddSaturateS");
  }
  else if (PrintSignature.this._6_2_ == wbI8AddSaturateU) {
    Output::Print(L"I8AddSaturateU");
  }
  else if (PrintSignature.this._6_2_ == wbI8Sub) {
    Output::Print(L"I8Sub");
  }
  else if (PrintSignature.this._6_2_ == wbI8SubSaturateS) {
    Output::Print(L"I8SubSaturateS");
  }
  else if (PrintSignature.this._6_2_ == wbI8SubSaturateU) {
    Output::Print(L"I8SubSaturateU");
  }
  else if (PrintSignature.this._6_2_ == wbI8Mul) {
    Output::Print(L"I8Mul");
  }
  else if (PrintSignature.this._6_2_ == wbI4Neg) {
    Output::Print(L"I4Neg");
  }
  else if (PrintSignature.this._6_2_ == wbI4AnyTrue) {
    Output::Print(L"I4AnyTrue");
  }
  else if (PrintSignature.this._6_2_ == wbI4AllTrue) {
    Output::Print(L"I4AllTrue");
  }
  else if (PrintSignature.this._6_2_ == wbI4Shl) {
    Output::Print(L"I4Shl");
  }
  else if (PrintSignature.this._6_2_ == wbI4ShrS) {
    Output::Print(L"I4ShrS");
  }
  else if (PrintSignature.this._6_2_ == wbI4ShrU) {
    Output::Print(L"I4ShrU");
  }
  else if (PrintSignature.this._6_2_ == wbI4Add) {
    Output::Print(L"I4Add");
  }
  else if (PrintSignature.this._6_2_ == wbI4Sub) {
    Output::Print(L"I4Sub");
  }
  else if (PrintSignature.this._6_2_ == wbI4Mul) {
    Output::Print(L"I4Mul");
  }
  else if (PrintSignature.this._6_2_ == wbI2Neg) {
    Output::Print(L"I2Neg");
  }
  else if (PrintSignature.this._6_2_ == wbI2Shl) {
    Output::Print(L"I2Shl");
  }
  else if (PrintSignature.this._6_2_ == wbI2ShrS) {
    Output::Print(L"I2ShrS");
  }
  else if (PrintSignature.this._6_2_ == wbI2ShrU) {
    Output::Print(L"I2ShrU");
  }
  else if (PrintSignature.this._6_2_ == wbI2Add) {
    Output::Print(L"I2Add");
  }
  else if (PrintSignature.this._6_2_ == wbI2Sub) {
    Output::Print(L"I2Sub");
  }
  else if (PrintSignature.this._6_2_ == wbF4Abs) {
    Output::Print(L"F4Abs");
  }
  else if (PrintSignature.this._6_2_ == wbF4Neg) {
    Output::Print(L"F4Neg");
  }
  else if (PrintSignature.this._6_2_ == wbF4Sqrt) {
    Output::Print(L"F4Sqrt");
  }
  else if (PrintSignature.this._6_2_ == wbF4Add) {
    Output::Print(L"F4Add");
  }
  else if (PrintSignature.this._6_2_ == wbF4Sub) {
    Output::Print(L"F4Sub");
  }
  else if (PrintSignature.this._6_2_ == wbF4Mul) {
    Output::Print(L"F4Mul");
  }
  else if (PrintSignature.this._6_2_ == wbF4Div) {
    Output::Print(L"F4Div");
  }
  else if (PrintSignature.this._6_2_ == wbF4Min) {
    Output::Print(L"F4Min");
  }
  else if (PrintSignature.this._6_2_ == wbF4Max) {
    Output::Print(L"F4Max");
  }
  else if (PrintSignature.this._6_2_ == wbF2Abs) {
    Output::Print(L"F2Abs");
  }
  else if (PrintSignature.this._6_2_ == wbF2Neg) {
    Output::Print(L"F2Neg");
  }
  else if (PrintSignature.this._6_2_ == wbF2Sqrt) {
    Output::Print(L"F2Sqrt");
  }
  else if (PrintSignature.this._6_2_ == wbF2Add) {
    Output::Print(L"F2Add");
  }
  else if (PrintSignature.this._6_2_ == wbF2Sub) {
    Output::Print(L"F2Sub");
  }
  else if (PrintSignature.this._6_2_ == wbF2Mul) {
    Output::Print(L"F2Mul");
  }
  else if (PrintSignature.this._6_2_ == wbF2Div) {
    Output::Print(L"F2Div");
  }
  else if (PrintSignature.this._6_2_ == wbF2Min) {
    Output::Print(L"F2Min");
  }
  else if (PrintSignature.this._6_2_ == wbF2Max) {
    Output::Print(L"F2Max");
  }
  else if (PrintSignature.this._6_2_ == wbI4TruncS) {
    Output::Print(L"I4TruncS");
  }
  else if (PrintSignature.this._6_2_ == wbI4TruncU) {
    Output::Print(L"I4TruncU");
  }
  else if (PrintSignature.this._6_2_ == wbF4ConvertS) {
    Output::Print(L"F4ConvertS");
  }
  else if (PrintSignature.this._6_2_ == wbF4ConvertU) {
    Output::Print(L"F4ConvertU");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicLoad) {
    Output::Print(L"I32AtomicLoad");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicLoad) {
    Output::Print(L"I64AtomicLoad");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicLoad8U) {
    Output::Print(L"I32AtomicLoad8U");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicLoad16U) {
    Output::Print(L"I32AtomicLoad16U");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicLoad8U) {
    Output::Print(L"I64AtomicLoad8U");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicLoad16U) {
    Output::Print(L"I64AtomicLoad16U");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicLoad32U) {
    Output::Print(L"I64AtomicLoad32U");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicStore) {
    Output::Print(L"I32AtomicStore");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicStore) {
    Output::Print(L"I64AtomicStore");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicStore8) {
    Output::Print(L"I32AtomicStore8");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicStore16) {
    Output::Print(L"I32AtomicStore16");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicStore8) {
    Output::Print(L"I64AtomicStore8");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicStore16) {
    Output::Print(L"I64AtomicStore16");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicStore32) {
    Output::Print(L"I64AtomicStore32");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmwAdd) {
    Output::Print(L"I32AtomicRmwAdd");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmwAdd) {
    Output::Print(L"I64AtomicRmwAdd");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw8UAdd) {
    Output::Print(L"I32AtomicRmw8UAdd");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw16UAdd) {
    Output::Print(L"I32AtomicRmw16UAdd");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw8UAdd) {
    Output::Print(L"I64AtomicRmw8UAdd");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw16UAdd) {
    Output::Print(L"I64AtomicRmw16UAdd");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw32UAdd) {
    Output::Print(L"I64AtomicRmw32UAdd");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmwSub) {
    Output::Print(L"I32AtomicRmwSub");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmwSub) {
    Output::Print(L"I64AtomicRmwSub");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw8USub) {
    Output::Print(L"I32AtomicRmw8USub");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw16USub) {
    Output::Print(L"I32AtomicRmw16USub");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw8USub) {
    Output::Print(L"I64AtomicRmw8USub");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw16USub) {
    Output::Print(L"I64AtomicRmw16USub");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw32USub) {
    Output::Print(L"I64AtomicRmw32USub");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmwAnd) {
    Output::Print(L"I32AtomicRmwAnd");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmwAnd) {
    Output::Print(L"I64AtomicRmwAnd");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw8UAnd) {
    Output::Print(L"I32AtomicRmw8UAnd");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw16UAnd) {
    Output::Print(L"I32AtomicRmw16UAnd");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw8UAnd) {
    Output::Print(L"I64AtomicRmw8UAnd");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw16UAnd) {
    Output::Print(L"I64AtomicRmw16UAnd");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw32UAnd) {
    Output::Print(L"I64AtomicRmw32UAnd");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmwOr) {
    Output::Print(L"I32AtomicRmwOr");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmwOr) {
    Output::Print(L"I64AtomicRmwOr");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw8UOr) {
    Output::Print(L"I32AtomicRmw8UOr");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw16UOr) {
    Output::Print(L"I32AtomicRmw16UOr");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw8UOr) {
    Output::Print(L"I64AtomicRmw8UOr");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw16UOr) {
    Output::Print(L"I64AtomicRmw16UOr");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw32UOr) {
    Output::Print(L"I64AtomicRmw32UOr");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmwXor) {
    Output::Print(L"I32AtomicRmwXor");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmwXor) {
    Output::Print(L"I64AtomicRmwXor");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw8UXor) {
    Output::Print(L"I32AtomicRmw8UXor");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw16UXor) {
    Output::Print(L"I32AtomicRmw16UXor");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw8UXor) {
    Output::Print(L"I64AtomicRmw8UXor");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw16UXor) {
    Output::Print(L"I64AtomicRmw16UXor");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw32UXor) {
    Output::Print(L"I64AtomicRmw32UXor");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmwXchg) {
    Output::Print(L"I32AtomicRmwXchg");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmwXchg) {
    Output::Print(L"I64AtomicRmwXchg");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw8UXchg) {
    Output::Print(L"I32AtomicRmw8UXchg");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw16UXchg) {
    Output::Print(L"I32AtomicRmw16UXchg");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw8UXchg) {
    Output::Print(L"I64AtomicRmw8UXchg");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw16UXchg) {
    Output::Print(L"I64AtomicRmw16UXchg");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw32UXchg) {
    Output::Print(L"I64AtomicRmw32UXchg");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmwCmpxchg) {
    Output::Print(L"I32AtomicRmwCmpxchg");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmwCmpxchg) {
    Output::Print(L"I64AtomicRmwCmpxchg");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw8UCmpxchg) {
    Output::Print(L"I32AtomicRmw8UCmpxchg");
  }
  else if (PrintSignature.this._6_2_ == wbI32AtomicRmw16UCmpxchg) {
    Output::Print(L"I32AtomicRmw16UCmpxchg");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw8UCmpxchg) {
    Output::Print(L"I64AtomicRmw8UCmpxchg");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw16UCmpxchg) {
    Output::Print(L"I64AtomicRmw16UCmpxchg");
  }
  else if (PrintSignature.this._6_2_ == wbI64AtomicRmw32UCmpxchg) {
    Output::Print(L"I64AtomicRmw32UCmpxchg");
  }
  uVar6 = (uint)PrintSignature.this._6_2_;
  if (uVar6 - 2 < 3) {
    pWVar8 = GetReader(this);
    bVar3 = WasmBlock::IsSingleResult(&(pWVar8->m_currentNode).field_1.block);
    if (bVar3) {
      pWVar8 = GetReader(this);
      type = WasmBlock::GetSingleResult(&(pWVar8->m_currentNode).field_1.block);
      pcVar7 = WasmTypes::GetTypeName(type);
      Output::Print(L" () -> %s",pcVar7);
    }
    else {
      pWVar8 = GetReader(this);
      uVar4 = WasmBlock::GetSignatureId(&(pWVar8->m_currentNode).field_1.block);
      PrintOpBegin::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)&funcType,uVar4);
    }
  }
  else if (uVar6 - 0xc < 2) {
    pWVar8 = GetReader(this);
    Output::Print(L" depth: %u",(ulong)(pWVar8->m_currentNode).field_1.brTable.numTargets);
  }
  else if (uVar6 == 0xe) {
    pWVar8 = GetReader(this);
    uVar6 = (pWVar8->m_currentNode).field_1.brTable.numTargets;
    pWVar8 = GetReader(this);
    Output::Print(L" %u cases, default: %u",(ulong)uVar6,
                  (ulong)(pWVar8->m_currentNode).field_1.brTable.defaultTarget);
  }
  else if (uVar6 == 0x10) {
    pWVar8 = GetReader(this);
    uVar6 = (pWVar8->m_currentNode).field_1.brTable.numTargets;
    uVar4 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
    if (uVar6 < uVar4) {
      pWVar8 = GetReader(this);
      switch((pWVar8->m_currentNode).field_1.call.funcType) {
      case ImportThunk:
        Output::Print(L" (thunk) ");
        break;
      case Function:
        Output::Print(L" (func) ");
        break;
      case Import:
        Output::Print(L" (import) ");
        break;
      case Invalid:
        Output::Print(L" (invalid) ");
        break;
      default:
        Output::Print(L" (unknown)");
      }
      this_00 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,uVar6);
      this_01 = WasmFunctionInfo::GetBody(this_00);
      Js::FunctionBody::DumpFullFunctionName(this_01);
    }
    else {
      Output::Print(L" invalid id %u",(ulong)uVar6);
    }
  }
  else if (uVar6 == 0x11) {
    pWVar8 = GetReader(this);
    PrintOpBegin::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&funcType,
               (pWVar8->m_currentNode).field_1.brTable.numTargets);
  }
  else if (uVar6 - 0x20 < 5) {
    pWVar8 = GetReader(this);
    Output::Print(L" (%d)",(ulong)(pWVar8->m_currentNode).field_1.brTable.numTargets);
  }
  else {
    if (0x16 < uVar6 - 0x28) {
      if (uVar6 == 0x41) {
        pWVar8 = GetReader(this);
        uVar6 = (pWVar8->m_currentNode).field_1.brTable.numTargets;
        pWVar8 = GetReader(this);
        Output::Print(L" (%d, 0x%x)",(ulong)uVar6,
                      (ulong)(pWVar8->m_currentNode).field_1.brTable.numTargets);
        goto switchD_0161c48d_default;
      }
      if (uVar6 == 0x42) {
        pWVar8 = GetReader(this);
        WVar2 = (pWVar8->m_currentNode).field_1.block;
        pWVar8 = GetReader(this);
        Output::Print(L" (%lld, 0x%llx)",WVar2,(pWVar8->m_currentNode).field_1.block);
        goto switchD_0161c48d_default;
      }
      if (uVar6 == 0x43) {
        pWVar8 = GetReader(this);
        Output::Print(L" (%.4f)",(double)*(float *)&(pWVar8->m_currentNode).field_1);
        goto switchD_0161c48d_default;
      }
      if (uVar6 == 0x44) {
        pWVar8 = GetReader(this);
        Output::Print(L" (%.4f)",(pWVar8->m_currentNode).field_1.block);
        goto switchD_0161c48d_default;
      }
      if (((uVar6 != 0xfd00) && (uVar6 != 0xfd0b)) && (0x3e < uVar6 - 0xfe10))
      goto switchD_0161c48d_default;
    }
    pWVar8 = GetReader(this);
    bVar1 = (pWVar8->m_currentNode).field_1.mem.alignment;
    pWVar8 = GetReader(this);
    uVar6 = (pWVar8->m_currentNode).field_1.brTable.numTargets;
    switch((uVar6 != 0) + (bVar1 != 0) * '\x02') {
    case '\0':
      Output::Print(L" [i]");
      break;
    case '\x01':
      Output::Print(L" [i + %u (0x%x)]",(ulong)uVar6,(ulong)uVar6);
      break;
    case '\x02':
      Output::Print(L" [i & ~0x%x]",(ulong)((1 << (bVar1 & 0x1f)) - 1));
      break;
    case '\x03':
      Output::Print(L" [i + %u (0x%x) & ~0x%x]",(ulong)uVar6,(ulong)uVar6,
                    (ulong)((1 << (bVar1 & 0x1f)) - 1));
    }
  }
switchD_0161c48d_default:
  Output::SkipToColumn(0x28);
  PrintTypeStack(this);
  return;
}

Assistant:

void WasmBytecodeGenerator::PrintOpBegin(WasmOp op)
{
    if (lastOpId == opId) Output::Print(_u("\r\n"));
    lastOpId = ++opId;
    const int depth = m_blockInfos.Count() - 1;
    if (depth > 0)
    {
        Output::SkipToColumn(depth);
    }
    const auto PrintSignature = [this](uint32 sigId)
    {
        if (sigId < m_module->GetSignatureCount())
        {
            Output::Print(_u(" "));
            WasmSignature* sig = m_module->GetSignature(sigId);
            sig->Dump(64);
        }
        else
        {
            Output::Print(_u(" invalid signature id %u"), sigId);
        }
    };

    switch (op)
    {
#define WASM_OPCODE(opname, ...) \
case wb##opname: \
    Output::Print(_u(#opname)); \
    break;
#include "WasmBinaryOpCodes.h"
    }
    switch (op)
    {
    case wbIf:
    case wbLoop:
    case wbBlock: 
        if (GetReader()->m_currentNode.block.IsSingleResult())
        {
            Output::Print(_u(" () -> %s"), GetTypeName(GetReader()->m_currentNode.block.GetSingleResult()));
        }
        else
        {
            PrintSignature(GetReader()->m_currentNode.block.GetSignatureId()); break;
        }
        break;
    case wbBr:
    case wbBrIf: Output::Print(_u(" depth: %u"), GetReader()->m_currentNode.br.depth); break;
    case wbBrTable: Output::Print(_u(" %u cases, default: %u"), GetReader()->m_currentNode.brTable.numTargets, GetReader()->m_currentNode.brTable.defaultTarget); break;
    case wbCallIndirect: PrintSignature(GetReader()->m_currentNode.call.num); break;
    case wbCall:
    {
        uint32 id = GetReader()->m_currentNode.call.num;
        if (id < m_module->GetWasmFunctionCount())
        {
            FunctionIndexTypes::Type funcType = GetReader()->m_currentNode.call.funcType;
            switch (funcType)
            {
            case Wasm::FunctionIndexTypes::Invalid: Output::Print(_u(" (invalid) ")); break;
            case Wasm::FunctionIndexTypes::ImportThunk: Output::Print(_u(" (thunk) ")); break;
            case Wasm::FunctionIndexTypes::Function: Output::Print(_u(" (func) ")); break;
            case Wasm::FunctionIndexTypes::Import: Output::Print(_u(" (import) ")); break;
            default:  Output::Print(_u(" (unknown)")); break;
            }
            auto func = this->m_module->GetWasmFunctionInfo(id);
            func->GetBody()->DumpFullFunctionName();
        }
        else
        {
            Output::Print(_u(" invalid id %u"), id);
        }
        break;
    }
    case wbSetLocal:
    case wbGetLocal:
    case wbTeeLocal:
    case wbGetGlobal:
    case wbSetGlobal: Output::Print(_u(" (%d)"), GetReader()->m_currentNode.var.num); break;
    case wbI32Const: Output::Print(_u(" (%d, 0x%x)"), GetReader()->m_currentNode.cnst.i32, GetReader()->m_currentNode.cnst.i32); break;
    case wbI64Const: Output::Print(_u(" (%lld, 0x%llx)"), GetReader()->m_currentNode.cnst.i64, GetReader()->m_currentNode.cnst.i64); break;
    case wbF32Const: Output::Print(_u(" (%.4f)"), GetReader()->m_currentNode.cnst.f32); break;
    case wbF64Const: Output::Print(_u(" (%.4f)"), GetReader()->m_currentNode.cnst.f64); break;
#define WASM_MEM_OPCODE(opname, ...) case wb##opname: // FallThrough
#include "WasmBinaryOpCodes.h"
    {
        const uint8 alignment = GetReader()->m_currentNode.mem.alignment;
        const uint32 offset = GetReader()->m_currentNode.mem.offset;
        switch (((!!alignment) << 1) | (!!offset))
        {
        case 0: // no alignment, no offset
            Output::Print(_u(" [i]")); break;
        case 1: // no alignment, offset
            Output::Print(_u(" [i + %u (0x%x)]"), offset, offset); break;
        case 2: // alignment, no offset
            Output::Print(_u(" [i & ~0x%x]"), (1 << alignment) - 1); break;
        case 3: // alignment, offset
            Output::Print(_u(" [i + %u (0x%x) & ~0x%x]"), offset, offset, (1 << alignment) - 1); break;
        }
        break;
    }
    }
    Output::SkipToColumn(40);
    PrintTypeStack();
}